

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

CompareMode glu::mapGLCompareFunc(deUint32 mode)

{
  InternalError *this;
  deUint64 local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  uint local_10;
  CompareMode local_c;
  deUint32 mode_local;
  
  switch(mode) {
  case 0x200:
    local_c = COMPAREMODE_NEVER;
    break;
  case 0x201:
    local_c = COMPAREMODE_LESS;
    break;
  case 0x202:
    local_c = COMPAREMODE_EQUAL;
    break;
  case 0x203:
    local_c = COMPAREMODE_LESS_OR_EQUAL;
    break;
  case 0x204:
    local_c = COMPAREMODE_GREATER;
    break;
  case 0x205:
    local_c = COMPAREMODE_NOT_EQUAL;
    break;
  case 0x206:
    local_c = COMPAREMODE_GREATER_OR_EQUAL;
    break;
  case 0x207:
    local_c = COMPAREMODE_ALWAYS;
    break;
  default:
    local_10 = mode;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    local_58 = (deUint64)tcu::toHex<unsigned_int>(local_10);
    tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_50,&local_58);
    std::operator+(&local_30,"Can\'t map GL compare mode ",&local_50);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

tcu::Sampler::CompareMode mapGLCompareFunc (deUint32 mode)
{
	switch (mode)
	{
		case GL_LESS:		return tcu::Sampler::COMPAREMODE_LESS;
		case GL_LEQUAL:		return tcu::Sampler::COMPAREMODE_LESS_OR_EQUAL;
		case GL_GREATER:	return tcu::Sampler::COMPAREMODE_GREATER;
		case GL_GEQUAL:		return tcu::Sampler::COMPAREMODE_GREATER_OR_EQUAL;
		case GL_EQUAL:		return tcu::Sampler::COMPAREMODE_EQUAL;
		case GL_NOTEQUAL:	return tcu::Sampler::COMPAREMODE_NOT_EQUAL;
		case GL_ALWAYS:		return tcu::Sampler::COMPAREMODE_ALWAYS;
		case GL_NEVER:		return tcu::Sampler::COMPAREMODE_NEVER;
		default:
			throw tcu::InternalError("Can't map GL compare mode " + tcu::toHex(mode).toString());
	}
}